

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

void wasm::Literal::printVec128(ostream *o,array<unsigned_char,_16UL> *v)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  
  *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
       *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 8;
  uVar3 = 0xfffffffffffffffc;
  do {
    if (uVar3 != 0xfffffffffffffffc) {
      std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"0x",2);
    lVar2 = *(long *)o;
    poVar1 = o + *(long *)(lVar2 + -0x18);
    if (o[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar2 = *(long *)o;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(undefined8 *)(o + *(long *)(lVar2 + -0x18) + 0x10) = 8;
    std::ostream::_M_insert<unsigned_long>((ulong)o);
    uVar3 = uVar3 + 4;
  } while (uVar3 < 0xc);
  *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
       *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void Literal::printVec128(std::ostream& o, const std::array<uint8_t, 16>& v) {
  o << std::hex;
  for (auto i = 0; i < 16; i += 4) {
    if (i) {
      o << " ";
    }
    o << "0x" << std::setfill('0') << std::setw(8)
      << uint32_t(v[i] | (v[i + 1] << 8) | (v[i + 2] << 16) | (v[i + 3] << 24));
  }
  o << std::dec;
}